

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O2

string * __thiscall
CodeGen::generateType_abi_cxx11_(string *__return_storage_ptr__,CodeGen *this,NodePtr *n)

{
  element_type *peVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  NodePtr nn;
  key_type local_28;
  
  peVar1 = n->px;
  if (peVar1->type_ == AVRO_NUM_TYPES) {
    avro::resolveSymbol((avro *)&local_28,n);
  }
  else {
    local_28.pn.pi_ = (n->pn).pi_;
    local_28.px = peVar1;
    if (local_28.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_28.pn.pi_)->use_count_ = (local_28.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
  }
  iVar2 = std::
          _Rb_tree<boost::shared_ptr<avro::Node>,_std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->done)._M_t,&local_28);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->done)._M_t._M_impl.super__Rb_tree_header) {
    doGenerateType_abi_cxx11_(__return_storage_ptr__,this,&local_28);
    pmVar3 = std::
             map<boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->done,&local_28);
    std::__cxx11::string::_M_assign((string *)pmVar3);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&iVar2._M_node[1]._M_left);
  }
  boost::detail::shared_count::~shared_count(&local_28.pn);
  return __return_storage_ptr__;
}

Assistant:

string CodeGen::generateType(const NodePtr& n)
{
    NodePtr nn = (n->type() == avro::AVRO_SYMBOLIC) ?  resolveSymbol(n) : n;

    map<NodePtr, string>::const_iterator it = done.find(nn);
    if (it != done.end()) {
        return it->second;
    }
    string result = doGenerateType(nn);
    done[nn] = result;
    return result;
}